

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highlighting.cpp
# Opt level: O1

vector<duckdb::highlightToken,_true> *
duckdb::Highlighting::Tokenize
          (vector<duckdb::highlightToken,_true> *__return_storage_ptr__,char *buf,size_t len,
          bool is_dot_command,searchMatch *match)

{
  size_type __n;
  pointer phVar1;
  reference pvVar2;
  undefined3 in_register_00000009;
  tokenType tVar3;
  long lVar4;
  ulong __n_00;
  highlightToken search_token;
  pointer local_48;
  pointer phStack_40;
  pointer local_38;
  
  (__return_storage_ptr__->
  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (CONCAT31(in_register_00000009,is_dot_command) == 0) {
    GetParseTokens((vector<duckdb::highlightToken,_true> *)&local_48,buf,len);
  }
  else {
    GetDotCommandTokens((vector<duckdb::highlightToken,_true> *)&local_48,buf,len);
  }
  phVar1 = (__return_storage_ptr__->
           super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_start = local_48;
  (__return_storage_ptr__->
  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_finish = phStack_40;
  (__return_storage_ptr__->
  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_38;
  local_48 = (pointer)0x0;
  phStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  if (phVar1 != (pointer)0x0) {
    operator_delete(phVar1);
  }
  if (local_48 != (pointer)0x0) {
    operator_delete(local_48);
  }
  if ((match != (searchMatch *)0x0) &&
     (1 < (ulong)(((long)(__return_storage_ptr__->
                         super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                         ).
                         super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(__return_storage_ptr__->
                         super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                         ).
                         super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))) {
    __n_00 = 1;
    lVar4 = 0x18;
    do {
      __n = __n_00 - 1;
      pvVar2 = vector<duckdb::highlightToken,_true>::operator[](__return_storage_ptr__,__n);
      if ((pvVar2->start <= match->match_start) &&
         (pvVar2 = vector<duckdb::highlightToken,_true>::operator[](__return_storage_ptr__,__n_00),
         match->match_start <= pvVar2->start)) {
        pvVar2 = vector<duckdb::highlightToken,_true>::operator[](__return_storage_ptr__,__n);
        tVar3 = pvVar2->type;
        pvVar2 = vector<duckdb::highlightToken,_true>::operator[](__return_storage_ptr__,__n);
        if (pvVar2->start == match->match_start) {
          pvVar2 = vector<duckdb::highlightToken,_true>::operator[](__return_storage_ptr__,__n);
          pvVar2->search_match = true;
        }
        else {
          phStack_40 = (pointer)0x0;
          local_38 = (pointer)((ulong)local_38 & 0xffffffffffffff00);
          pvVar2 = vector<duckdb::highlightToken,_true>::operator[](__return_storage_ptr__,__n);
          local_48 = (pointer)CONCAT71(local_48._1_7_,pvVar2->type);
          phStack_40 = (pointer)match->match_start;
          local_38 = (pointer)CONCAT71(local_38._1_7_,1);
          ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::insert
                    (&__return_storage_ptr__->
                      super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,
                     (highlightToken *)
                     (&((__return_storage_ptr__->
                        super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                        ).
                        super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                        ._M_impl.super__Vector_impl_data._M_start)->type + lVar4),
                     (value_type *)&local_48);
          __n_00 = __n_00 + 1;
        }
        lVar4 = (long)(__return_storage_ptr__->
                      super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>)
                      .
                      super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(__return_storage_ptr__->
                      super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>)
                      .
                      super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        while ((__n_00 < (ulong)((lVar4 >> 3) * -0x5555555555555555) &&
               (pvVar2 = vector<duckdb::highlightToken,_true>::operator[]
                                   (__return_storage_ptr__,__n_00), pvVar2->start < match->match_end
               ))) {
          pvVar2 = vector<duckdb::highlightToken,_true>::operator[](__return_storage_ptr__,__n_00);
          tVar3 = pvVar2->type;
          pvVar2 = vector<duckdb::highlightToken,_true>::operator[](__return_storage_ptr__,__n_00);
          pvVar2->search_match = true;
          lVar4 = (long)(__return_storage_ptr__->
                        super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                        ).
                        super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(__return_storage_ptr__->
                        super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                        ).
                        super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          __n_00 = __n_00 + 1;
        }
        if ((__n_00 < (ulong)(((long)(__return_storage_ptr__->
                                     super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                     ).
                                     super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(__return_storage_ptr__->
                                     super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                     ).
                                     super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555)) &&
           (pvVar2 = vector<duckdb::highlightToken,_true>::operator[](__return_storage_ptr__,__n_00)
           , pvVar2->start <= match->match_end)) {
          return __return_storage_ptr__;
        }
        local_38 = (pointer)((ulong)local_38 & 0xffffffffffffff00);
        local_48 = (pointer)CONCAT71(local_48._1_7_,tVar3);
        phStack_40 = (pointer)match->match_end;
        ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::insert
                  (&__return_storage_ptr__->
                    super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,
                   (__return_storage_ptr__->
                   super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                   super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                   ._M_impl.super__Vector_impl_data._M_start + __n_00,(value_type *)&local_48);
        return __return_storage_ptr__;
      }
      __n_00 = __n_00 + 1;
      lVar4 = lVar4 + 0x18;
    } while (__n_00 < (ulong)(((long)(__return_storage_ptr__->
                                     super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                     ).
                                     super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(__return_storage_ptr__->
                                     super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                     ).
                                     super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<highlightToken> Highlighting::Tokenize(char *buf, size_t len, bool is_dot_command, searchMatch *match) {
	vector<highlightToken> tokens;
	if (!is_dot_command) {
		// SQL query - use parser to obtain tokens
		tokens = GetParseTokens(buf, len);
	} else {
		// . command
		tokens = GetDotCommandTokens(buf, len);
	}
	if (match) {
		// we have a search match - insert it into the token list
		// we want to insert a search token with start = match_start, end = match_end
		// first figure out which token type we would have at match_end (if any)
		for (size_t i = 0; i + 1 < tokens.size(); i++) {
			if (tokens[i].start <= match->match_start && tokens[i + 1].start >= match->match_start) {
				// this token begins after the search position, insert the token here
				size_t token_position = i + 1;
				auto end_type = tokens[i].type;
				if (tokens[i].start == match->match_start) {
					// exact start: only set the search match
					tokens[i].search_match = true;
				} else {
					// non-exact start: add a new token
					highlightToken search_token;
					search_token.type = tokens[i].type;
					search_token.start = match->match_start;
					search_token.search_match = true;
					tokens.insert(tokens.begin() + token_position, search_token);
					token_position++;
				}

				// move forwards
				while (token_position < tokens.size() && tokens[token_position].start < match->match_end) {
					// this token is
					// mark this token as a search token
					end_type = tokens[token_position].type;
					tokens[token_position].search_match = true;
					token_position++;
				}
				if (token_position >= tokens.size() || tokens[token_position].start > match->match_end) {
					// insert the token that marks the end of the search
					highlightToken end_token;
					end_token.type = end_type;
					end_token.start = match->match_end;
					tokens.insert(tokens.begin() + token_position, end_token);
					token_position++;
				}
				break;
			}
		}
	}
	return tokens;
}